

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

string * __thiscall RigidBodyDynamics::Model::GetBodyName_abi_cxx11_(Model *this,uint body_id)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator __s;
  pointer ppVar2;
  uint in_EDX;
  string *in_RDI;
  const_iterator iter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_ffffffffffffff98;
  string *this_01;
  allocator<char> local_31;
  _Self in_stack_ffffffffffffffd0;
  
  this_01 = in_RDI;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::begin(in_stack_ffffffffffffff98);
  while( true ) {
    __s = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,(_Self *)&stack0xffffffffffffffd8);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 this_00._M_node,(char *)__s._M_node,
                 (allocator<char> *)in_stack_ffffffffffffffd0._M_node);
      std::allocator<char>::~allocator(&local_31);
      return this_01;
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                           *)in_RDI);
    if (ppVar2->second == in_EDX) break;
    in_stack_ffffffffffffffd0 =
         std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
         ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                       *)this_01,(int)((ulong)in_RDI >> 0x20));
  }
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                         *)in_RDI);
  std::__cxx11::string::string((string *)in_RDI,(string *)ppVar2);
  return this_01;
}

Assistant:

std::string GetBodyName (unsigned int body_id) const
  {
    std::map<std::string, unsigned int>::const_iterator iter
      = mBodyNameMap.begin();

    while (iter != mBodyNameMap.end()) {
      if (iter->second == body_id) {
        return iter->first;
      }

      iter++;
    }

    return "";
  }